

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
         *this,size_t new_capacity)

{
  tuple<unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_> *alloc;
  ctrl_t *p;
  size_t capacity;
  size_t hashval;
  size_t i;
  size_t sVar1;
  slot_type *arg;
  FindInfo FVar2;
  Layout LVar3;
  HashElement local_38;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    arg = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    alloc = &this->settings_;
    for (sVar1 = 0; capacity != sVar1; sVar1 = sVar1 + 1) {
      if (-1 < p[sVar1]) {
        local_38.h = (hasher *)alloc;
        hashval = DecomposeValue<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,phmap::Hash<Person>,phmap::EqualTo<Person>,std::allocator<Person>>::HashElement,Person&>
                            (&local_38,arg);
        FVar2 = find_first_non_full(this,hashval);
        set_ctrl(this,FVar2.offset,(byte)hashval & 0x7f);
        FlatHashSetPolicy<Person>::transfer<std::allocator<Person>>
                  ((allocator<Person> *)alloc,this->slots_ + FVar2.offset,arg);
      }
      arg = arg + 1;
    }
    if (capacity != 0) {
      LVar3 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<Person>>
                ((allocator<Person> *)alloc,p,
                 LVar3.super_LayoutType<sizeof___(Ts),_signed_char,_Person>.size_[1] * 0x48 +
                 (LVar3.super_LayoutType<sizeof___(Ts),_signed_char,_Person>.size_[0] + 7 &
                 0xfffffffffffffff8));
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
               );
}

Assistant:

void resize(size_t new_capacity) {
        assert(IsValidCapacity(new_capacity));
        auto* old_ctrl = ctrl_;
        auto* old_slots = slots_;
        const size_t old_capacity = capacity_;
        initialize_slots(new_capacity);
        capacity_ = new_capacity;

        for (size_t i = 0; i != old_capacity; ++i) {
            if (IsFull(old_ctrl[i])) {
                size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                     PolicyTraits::element(old_slots + i));
                auto target = find_first_non_full(hashval);
                size_t new_i = target.offset;
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, old_slots + i);
            }
        }
        if (old_capacity) {
            SanitizerUnpoisonMemoryRegion(old_slots,
                                          sizeof(slot_type) * old_capacity);
            auto layout = MakeLayout(old_capacity);
            Deallocate<Layout::Alignment()>(&alloc_ref(), old_ctrl,
                                            layout.AllocSize());
        }
    }